

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

IRNode * __thiscall kratos::SequentialStmtBlock::get_child(SequentialStmtBlock *this,uint64_t index)

{
  size_type sVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar2;
  reference pvVar3;
  value_type *cond;
  uint64_t index_local;
  SequentialStmtBlock *this_local;
  
  sVar1 = std::
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
          size(&(this->super_StmtBlock).stmts_);
  if (index < sVar1) {
    this_00 = &std::
               vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ::operator[](&(this->super_StmtBlock).stmts_,index)->
               super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
    this_local = (SequentialStmtBlock *)
                 std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  }
  else {
    sVar1 = std::
            vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
            size(&(this->super_StmtBlock).stmts_);
    sVar2 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::size
                      (&this->conditions_);
    if (index < sVar1 + sVar2) {
      sVar1 = std::
              vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ::size(&(this->super_StmtBlock).stmts_);
      pvVar3 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::operator[]
                         (&this->conditions_,index - sVar1);
      this_local = (SequentialStmtBlock *)pvVar3->var;
    }
    else {
      this_local = (SequentialStmtBlock *)0x0;
    }
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *SequentialStmtBlock::get_child(uint64_t index) {
    if (index < stmts_.size()) {
        return stmts_[index].get();
    } else if (index < stmts_.size() + conditions_.size()) {
        auto const &cond = conditions_[index - stmts_.size()];
        return cond.var;
    }
    return nullptr;
}